

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shadertoy.cpp
# Opt level: O3

vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *
st::ParseOutputs(vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *__return_storage_ptr__
                ,Json *outputs)

{
  pointer *ppSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pJVar3;
  iterator __position;
  ShaderOutput SVar4;
  Type TVar5;
  vector<json11::Json,_std::allocator<json11::Json>_> *pvVar6;
  Json *pJVar7;
  pointer this;
  char *__end;
  ShaderOutput data;
  ShaderOutput local_58;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar5 = json11::Json::type(outputs);
  if (TVar5 == ARRAY) {
    pvVar6 = json11::Json::array_items(outputs);
    this = (pvVar6->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
           super__Vector_impl_data._M_start;
    pJVar3 = (pvVar6->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (this != pJVar3) {
      paVar2 = &local_50.field_2;
      do {
        local_50._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"channel","");
        pJVar7 = json11::Json::operator[](this,&local_50);
        local_58.Channel = json11::Json::int_value(pJVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_50._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"id","");
        pJVar7 = json11::Json::operator[](this,&local_50);
        local_58.ID = json11::Json::int_value(pJVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<st::ShaderOutput,std::allocator<st::ShaderOutput>>::
          _M_realloc_insert<st::ShaderOutput_const&>
                    ((vector<st::ShaderOutput,std::allocator<st::ShaderOutput>> *)
                     __return_storage_ptr__,__position,&local_58);
        }
        else {
          SVar4.Channel = local_58.Channel;
          SVar4.ID = local_58.ID;
          *__position._M_current = SVar4;
          ppSVar1 = &(__return_storage_ptr__->
                     super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        this = this + 1;
      } while (this != pJVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ShaderOutput> ParseOutputs(const json11::Json& outputs)
	{
		std::vector<ShaderOutput> ret;
		if (outputs.is_array()) {
			for (const auto& output : outputs.array_items()) {
				ShaderOutput data;
				data.Channel = output["channel"].int_value();
				data.ID = output["id"].int_value();
				ret.push_back(data);
			}
		}
		return ret;
	}